

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolui.c
# Opt level: O3

int ffgsfui(fitsfile *fptr,int colnum,int naxis,long *naxes,long *blc,long *trc,long *inc,
           unsigned_short *array,char *flagval,int *anynul,int *status)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  unsigned_short *array_00;
  long lVar7;
  bool bVar8;
  int local_374;
  long local_370;
  long local_368;
  long local_340;
  long local_338;
  long local_330;
  long local_328;
  long local_318;
  int hdutype;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  long str [9];
  long incr [9];
  long stp [9];
  long dsize [10];
  LONGLONG blcll [9];
  
  if (naxis - 10U < 0xfffffff7) {
    snprintf((char *)blcll,0x51,"NAXIS = %d in call to ffgsvi is out of range",(ulong)(uint)naxis);
    ffpmsg((char *)blcll);
    *status = 0x140;
    return 0x140;
  }
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 != 0) {
    memcpy(blcll,blc,(ulong)(uint)(naxis << 3));
    memcpy(dsize,trc,(ulong)(uint)(naxis << 3));
    fits_read_compressed_img(fptr,0x14,blcll,dsize,inc,2,(void *)0x0,array,flagval,anynul,status);
LAB_001665f0:
    return *status;
  }
  iVar1 = ffghdt(fptr,&hdutype,status);
  if (0 < iVar1) goto LAB_001665f0;
  uVar2 = (ulong)(uint)naxis;
  if (hdutype == 0) {
    local_370 = (long)(int)(colnum + (uint)(colnum == 0));
    local_374 = 2;
    local_300 = 1;
    local_368 = local_370;
  }
  else {
    local_370 = blc[uVar2];
    local_368 = trc[uVar2];
    local_300 = inc[uVar2];
    local_374 = colnum;
  }
  if (anynul != (int *)0x0) {
    *anynul = 0;
  }
  lVar3 = 0;
  do {
    str[lVar3] = 1;
    stp[lVar3] = 1;
    incr[lVar3] = 1;
    dsize[lVar3] = 1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 9);
  if (naxis != 0) {
    uVar4 = 1;
    do {
      lVar3 = trc[uVar4 - 1];
      if (lVar3 < blc[uVar4 - 1]) {
        snprintf((char *)blcll,0x51,"ffgsvi: illegal range specified for axis %ld");
        ffpmsg((char *)blcll);
        *status = 0x141;
        return 0x141;
      }
      str[uVar4 - 1] = blc[uVar4 - 1];
      stp[uVar4 - 1] = lVar3;
      incr[uVar4 - 1] = inc[uVar4 - 1];
      dsize[uVar4] = naxes[uVar4 - 1] * dsize[uVar4 - 1];
      bVar8 = uVar4 != uVar2;
      uVar4 = uVar4 + 1;
    } while (bVar8);
    if ((naxis == 1) && (*naxes == 1)) {
      lVar3 = (local_368 - local_370) / local_300;
      local_368 = local_370;
      local_270 = local_300;
      goto LAB_00166790;
    }
  }
  lVar3 = (stp[0] - str[0]) / *inc;
  local_270 = incr[0];
LAB_00166790:
  if (local_370 <= local_368) {
    local_2c8 = str[7];
    local_288 = str[6];
    local_290 = str[5];
    local_298 = str[4];
    local_1f8 = str[1];
    local_268 = (str[1] + -1) * dsize[1] + (str[2] + -1) * dsize[2] + (str[3] + -1) * dsize[3] +
                (str[4] + -1) * dsize[4] +
                (str[5] + -1) * dsize[5] + (str[6] + -1) * dsize[6] + (str[7] + -1) * dsize[7] +
                (str[8] + -1) * dsize[8] + str[0];
    local_1d8 = lVar3 * 2 + 2;
    local_260 = incr[8];
    local_258 = dsize[8] * incr[8];
    local_250 = incr[7];
    local_248 = dsize[7] * incr[7];
    local_240 = incr[6];
    local_238 = incr[5];
    local_230 = incr[4];
    local_228 = incr[3];
    local_210 = incr[2];
    local_208 = dsize[2] * incr[2];
    local_1e0 = incr[1];
    local_1d0 = dsize[1] * incr[1];
    local_2c0 = stp[7];
    local_2b8 = stp[6];
    local_2b0 = stp[5];
    local_2a8 = stp[4];
    local_2a0 = stp[3];
    local_278 = stp[2];
    lVar7 = 0;
    local_280 = str[3];
    local_200 = str[2];
    local_218 = stp[8];
    do {
      if (str[8] <= stp[8]) {
        local_340 = local_268;
        local_2f8 = str[8];
        do {
          if (local_2c8 <= local_2c0) {
            local_338 = local_340;
            local_2f0 = local_2c8;
            lVar6 = local_298;
            do {
              lVar5 = local_338;
              local_2e8 = str[6];
              if (str[6] <= local_2b8) {
                do {
                  local_330 = lVar5;
                  local_2e0 = str[5];
                  local_220 = lVar5;
                  if (str[5] <= local_2b0) {
                    do {
                      if (lVar6 <= local_2a8) {
                        local_328 = local_330;
                        local_2d8 = lVar6;
                        do {
                          if (str[3] <= local_2a0) {
                            local_318 = local_328;
                            local_2d0 = str[3];
                            do {
                              local_1f0 = str[2];
                              lVar5 = local_318;
                              if (str[2] <= local_278) {
                                do {
                                  local_1e8 = lVar5;
                                  if (local_1f8 <= stp[1]) {
                                    array_00 = array + lVar7;
                                    lVar6 = local_1f8;
                                    do {
                                      iVar1 = ffgclui(fptr,local_374,local_370,lVar5,lVar3 + 1,
                                                      local_270,2,0,array_00,flagval + lVar7,
                                                      (int *)blcll,status);
                                      if (0 < iVar1) {
                                        return *status;
                                      }
                                      if ((anynul != (int *)0x0) && ((int)blcll[0] != 0)) {
                                        *anynul = 1;
                                      }
                                      lVar7 = lVar7 + lVar3 + 1;
                                      lVar6 = lVar6 + local_1e0;
                                      array_00 = (unsigned_short *)((long)array_00 + local_1d8);
                                      lVar5 = lVar5 + local_1d0;
                                    } while (lVar6 <= stp[1]);
                                  }
                                  local_1f0 = local_1f0 + local_210;
                                  str[3] = local_280;
                                  str[2] = local_200;
                                  stp[8] = local_218;
                                  lVar5 = local_1e8 + local_208;
                                  str[6] = local_288;
                                  str[5] = local_290;
                                  lVar6 = local_298;
                                } while (local_1f0 <= local_278);
                              }
                              local_2d0 = local_2d0 + local_228;
                              local_318 = local_318 + dsize[3] * incr[3];
                              lVar5 = local_220;
                            } while (local_2d0 <= local_2a0);
                          }
                          local_2d8 = local_2d8 + local_230;
                          local_328 = local_328 + dsize[4] * incr[4];
                        } while (local_2d8 <= local_2a8);
                      }
                      local_2e0 = local_2e0 + local_238;
                      local_330 = local_330 + dsize[5] * incr[5];
                    } while (local_2e0 <= local_2b0);
                  }
                  local_2e8 = local_2e8 + local_240;
                  lVar5 = lVar5 + dsize[6] * incr[6];
                } while (local_2e8 <= local_2b8);
              }
              local_2f0 = local_2f0 + local_250;
              local_338 = local_338 + local_248;
              str[3] = local_280;
            } while (local_2f0 <= local_2c0);
          }
          local_2f8 = local_2f8 + local_260;
          local_340 = local_340 + local_258;
        } while (local_2f8 <= stp[8]);
      }
      local_370 = local_370 + local_300;
    } while (local_370 <= local_368);
  }
  return *status;
}

Assistant:

int ffgsfui(fitsfile *fptr, /* I - FITS file pointer                         */
           int  colnum,    /* I - number of the column to read (1 = 1st)    */
           int naxis,      /* I - number of dimensions in the FITS array    */
           long  *naxes,   /* I - size of each dimension                    */
           long  *blc,     /* I - 'bottom left corner' of the subsection    */
           long  *trc,     /* I - 'top right corner' of the subsection      */
           long  *inc,     /* I - increment to be applied in each dimension */
  unsigned short *array,   /* O - array to be filled and returned           */
           char *flagval,  /* O - set to 1 if corresponding value is null   */
           int  *anynul,   /* O - set to 1 if any values are null; else 0   */
           int  *status)   /* IO - error status                             */
/*
  Read a subsection of data values from an image or a table column.
  This routine is set up to handle a maximum of nine dimensions.
*/
{
    long ii,i0, i1,i2,i3,i4,i5,i6,i7,i8,row,rstr,rstp,rinc;
    long str[9],stp[9],incr[9],dsize[10];
    LONGLONG blcll[9], trcll[9];
    long felem, nelem, nultyp, ninc, numcol;
    int hdutype, anyf;
    unsigned short nulval = 0;
    char msg[FLEN_ERRMSG];
    int nullcheck = 2;

    if (naxis < 1 || naxis > 9)
    {
        snprintf(msg, FLEN_ERRMSG,"NAXIS = %d in call to ffgsvi is out of range", naxis);
        ffpmsg(msg);
        return(*status = BAD_DIMEN);
    }

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        for (ii=0; ii < naxis; ii++) {
	    blcll[ii] = blc[ii];
	    trcll[ii] = trc[ii];
	}

        fits_read_compressed_img(fptr, TUSHORT, blcll, trcll, inc,
            nullcheck, NULL, array, flagval, anynul, status);
        return(*status);
    }

/*
    if this is a primary array, then the input COLNUM parameter should
    be interpreted as the row number, and we will alway read the image
    data from column 2 (any group parameters are in column 1).
*/
    if (ffghdt(fptr, &hdutype, status) > 0)
        return(*status);

    if (hdutype == IMAGE_HDU)
    {
        /* this is a primary array, or image extension */
        if (colnum == 0)
        {
            rstr = 1;
            rstp = 1;
        }
        else
        {
            rstr = colnum;
            rstp = colnum;
        }
        rinc = 1;
        numcol = 2;
    }
    else
    {
        /* this is a table, so the row info is in the (naxis+1) elements */
        rstr = blc[naxis];
        rstp = trc[naxis];
        rinc = inc[naxis];
        numcol = colnum;
    }

    nultyp = 2;
    if (anynul)
        *anynul = FALSE;

    i0 = 0;
    for (ii = 0; ii < 9; ii++)
    {
        str[ii] = 1;
        stp[ii] = 1;
        incr[ii] = 1;
        dsize[ii] = 1;
    }

    for (ii = 0; ii < naxis; ii++)
    {
      if (trc[ii] < blc[ii])
      {
        snprintf(msg, FLEN_ERRMSG,"ffgsvi: illegal range specified for axis %ld", ii + 1);
        ffpmsg(msg);
        return(*status = BAD_PIX_NUM);
      }

      str[ii] = blc[ii];
      stp[ii] = trc[ii];
      incr[ii] = inc[ii];
      dsize[ii + 1] = dsize[ii] * naxes[ii];
    }

    if (naxis == 1 && naxes[0] == 1)
    {
      /* This is not a vector column, so read all the rows at once */
      nelem = (rstp - rstr) / rinc + 1;
      ninc = rinc;
      rstp = rstr;
    }
    else
    {
      /* have to read each row individually, in all dimensions */
      nelem = (stp[0] - str[0]) / inc[0] + 1;
      ninc = incr[0];
    }

    for (row = rstr; row <= rstp; row += rinc)
    {
     for (i8 = str[8]; i8 <= stp[8]; i8 += incr[8])
     {
      for (i7 = str[7]; i7 <= stp[7]; i7 += incr[7])
      {
       for (i6 = str[6]; i6 <= stp[6]; i6 += incr[6])
       {
        for (i5 = str[5]; i5 <= stp[5]; i5 += incr[5])
        {
         for (i4 = str[4]; i4 <= stp[4]; i4 += incr[4])
         {
          for (i3 = str[3]; i3 <= stp[3]; i3 += incr[3])
          {
           for (i2 = str[2]; i2 <= stp[2]; i2 += incr[2])
           {
            for (i1 = str[1]; i1 <= stp[1]; i1 += incr[1])
            {
              felem=str[0] + (i1 - 1) * dsize[1] + (i2 - 1) * dsize[2] + 
                             (i3 - 1) * dsize[3] + (i4 - 1) * dsize[4] +
                             (i5 - 1) * dsize[5] + (i6 - 1) * dsize[6] +
                             (i7 - 1) * dsize[7] + (i8 - 1) * dsize[8];

              if ( ffgclui(fptr, numcol, row, felem, nelem, ninc, nultyp,
                   nulval, &array[i0], &flagval[i0], &anyf, status) > 0)
                   return(*status);

              if (anyf && anynul)
                  *anynul = TRUE;

              i0 += nelem;
            }
           }
          }
         }
        }
       }
      }
     }
    }
    return(*status);
}